

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O0

void __thiscall helics::apps::Recorder::initialSetup(Recorder *this)

{
  bool bVar1;
  element_type *peVar2;
  App *in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  if ((in_RDI->deactivated & 1U) == 0) {
    peVar2 = CLI::std::
             __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3ef0ea);
    (*(peVar2->super_ValueFederate)._vptr_ValueFederate[2])(peVar2,0,1);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3ef108
                      );
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 in_stack_ffffffffffffffe8);
    }
    App::loadInputFiles(in_RDI);
  }
  return;
}

Assistant:

void Recorder::initialSetup()
{
    if (!deactivated) {
        fed->setFlagOption(HELICS_FLAG_OBSERVER);
        if (outFileName.empty()) {
            outFileName = "out.txt";
        }
        loadInputFiles();
    }
}